

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

void STAT_ChangeLevel(char *newl)

{
  uint *puVar1;
  FLevelStatistics *pFVar2;
  undefined1 auVar3 [16];
  FLevelStatistics *pFVar4;
  FStatistics *pFVar5;
  FString __src;
  int iVar6;
  uint uVar7;
  level_info_t *this;
  level_info_t *plVar8;
  MapData *this_00;
  char *pcVar9;
  tm *ptVar10;
  FILE *__stream;
  FStatistics *pFVar11;
  FStatistics *pFVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  FSessionStatistics *pFVar18;
  ulong uVar19;
  FString FVar20;
  bool bVar21;
  FString infostring;
  FString section;
  time_t clock;
  FString lsection;
  FSessionStatistics s;
  int iVar22;
  FString local_a8;
  FString local_a0;
  undefined1 local_98 [16];
  FString local_88;
  FString local_80;
  FSessionStatistics local_78;
  
  StoreLevelStats();
  iVar6 = strncmp(newl,"enDSeQ",6);
  if (iVar6 == 0) {
    plVar8 = (level_info_t *)0x0;
  }
  else {
    this = FindLevelInfo(newl,true);
    plVar8 = level_info_t::CheckLevelRedirect(this);
    if (plVar8 == (level_info_t *)0x0) {
      plVar8 = this;
    }
  }
  if ((savestatistics.Value == 1) &&
     (((plVar8 == (level_info_t *)0x0 || ((plVar8->flags2 & 0x20000000) != 0)) &&
      (StartEpisode != (FEpisode *)0x0)))) {
    iVar6 = 0;
    this_00 = P_OpenMapData((StartEpisode->mEpisodeMap).Chars,false);
    if (this_00 != (MapData *)0x0) {
      iVar6 = FWadCollection::GetLumpFile(&Wads,this_00->lumpnum);
      MapData::~MapData(this_00);
      operator_delete(this_00,0xe8);
    }
    pcVar9 = FWadCollection::GetWadName(&Wads,iVar6);
    pFVar12 = (FStatistics *)local_98;
    ExtractFileBase((char *)pFVar12,SUB81(pcVar9,0));
    FString::operator+((FString *)&local_78,(char *)pFVar12);
    FString::operator+(&local_a0,(FString *)&local_78);
    FString::~FString((FString *)&local_78);
    FString::~FString((FString *)local_98);
    FString::ToUpper(&local_a0);
    pcVar9 = (StartEpisode->mEpisodeName).Chars;
    if (*pcVar9 == '$') {
      pcVar9 = FStringTable::operator[](&GStrings,pcVar9 + 1);
    }
    pFVar5 = EpisodeStatistics.Array;
    uVar13 = (ulong)EpisodeStatistics.Count;
    bVar21 = uVar13 != 0;
    if (bVar21) {
      iVar6 = strcasecmp(local_a0.Chars,((EpisodeStatistics.Array)->epi_header).Chars);
      if (iVar6 == 0) {
        bVar21 = true;
        pFVar12 = pFVar5;
      }
      else {
        uVar19 = 1;
        pFVar11 = pFVar5;
        do {
          uVar15 = uVar19;
          pFVar12 = pFVar5 + (uVar13 - 1);
          if (uVar13 == uVar15) break;
          iVar6 = strcasecmp(local_a0.Chars,pFVar11[1].epi_header.Chars);
          pFVar12 = pFVar11 + 1;
          uVar19 = uVar15 + 1;
          pFVar11 = pFVar12;
        } while (iVar6 != 0);
        bVar21 = uVar15 < uVar13;
      }
    }
    if (!bVar21) {
      uVar7 = TArray<FStatistics,_FStatistics>::Reserve(&EpisodeStatistics,1);
      pFVar12 = EpisodeStatistics.Array;
      FString::operator=(&EpisodeStatistics.Array[uVar7].epi_header,local_a0.Chars);
      pFVar12 = pFVar12 + uVar7;
      FString::operator=(&pFVar12->epi_name,pcVar9);
    }
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_a8.Chars = FString::NullString.Nothing;
    if ((ulong)LevelData.Count == 0) {
      uVar19 = 0;
      uVar13 = 0;
      uVar15 = 0;
      uVar16 = 0;
    }
    else {
      lVar17 = 0;
      uVar16 = 0;
      uVar15 = 0;
      uVar13 = 0;
      uVar19 = 0;
      do {
        uVar19 = (ulong)(uint)((int)uVar19 + *(int *)((long)&(LevelData.Array)->killcount + lVar17))
        ;
        uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)&(LevelData.Array)->totalkills + lVar17)
                              );
        uVar15 = (ulong)(uint)((int)uVar15 +
                              *(int *)((long)&(LevelData.Array)->secretcount + lVar17));
        uVar16 = (ulong)(uint)((int)uVar16 +
                              *(int *)((long)&(LevelData.Array)->totalsecrets + lVar17));
        lVar17 = lVar17 + 0x20;
      } while ((ulong)LevelData.Count << 5 != lVar17);
    }
    FString::Format(&local_a8,"%4d/%4d, %3d/%3d, %2d",uVar19,uVar13,uVar15,uVar16,LevelData.Count);
    FVar20.Chars = local_a8.Chars;
    auVar3 = SEXT816((long)level.totaltime * 0x62) * ZEXT816(0xa3d70a3d70a3d70b);
    local_78.levelstats.Array = (FLevelStatistics *)0x0;
    local_78.levelstats.Most = 0;
    local_78.levelstats.Count = 0;
    time((time_t *)local_98);
    ptVar10 = localtime((time_t *)local_98);
    if (ptVar10 == (tm *)0x0) {
      builtin_strncpy(local_78.super_FLevelStatistics.name,"00.00.0000",0xb);
    }
    else {
      mysnprintf(local_78.super_FLevelStatistics.name,0xc,"%02d.%02d.%04d",
                 (ulong)(uint)ptVar10->tm_mday,(ulong)(ptVar10->tm_mon + 1),
                 (ulong)(ptVar10->tm_year + 0x76c));
    }
    iVar6 = G_SkillProperty(SKILLP_ACSReturn);
    local_78.super_FLevelStatistics.skill = (short)iVar6;
    strcpy((char *)&local_78,FVar20.Chars);
    local_78.super_FLevelStatistics.timeneeded = (int)(auVar3._8_8_ >> 6) - (auVar3._12_4_ >> 0x1f);
    TArray<FSessionStatistics,_FSessionStatistics>::Push(&pFVar12->stats,&local_78);
    uVar7 = (pFVar12->stats).Count;
    pFVar18 = (pFVar12->stats).Array;
    TArray<FLevelStatistics,_FLevelStatistics>::~TArray(&local_78.levelstats);
    if (LevelData.Count != 0) {
      uVar7 = uVar7 - 1;
      local_98._8_8_ = pFVar18 + uVar7;
      local_88.Chars = (char *)&pFVar18[uVar7].levelstats;
      lVar17 = 0x18;
      uVar13 = 0;
      do {
        FString::AttachToOther
                  ((FString *)(local_98 + 0x18),
                   (FString *)((long)&(LevelData.Array)->totalkills + lVar17));
        FString::ToUpper((FString *)(local_98 + 0x18));
        FString::Format(&local_a8,"%4d/%4d, %3d/%3d",
                        (ulong)*(uint *)((long)LevelData.Array + lVar17 + -0x14),
                        (ulong)*(uint *)((long)LevelData.Array + lVar17 + -0x18),
                        (ulong)*(uint *)((long)LevelData.Array + lVar17 + -0xc),
                        (ulong)*(uint *)((long)LevelData.Array + lVar17 + -0x10));
        __src.Chars = local_80.Chars;
        FVar20.Chars = local_a8.Chars;
        iVar6 = *(int *)((long)LevelData.Array + lVar17 + -8);
        time((time_t *)local_98);
        localtime((time_t *)local_98);
        strcpy(local_78.super_FLevelStatistics.name,__src.Chars);
        strcpy((char *)&local_78,FVar20.Chars);
        local_78.super_FLevelStatistics.timeneeded = iVar6;
        TArray<FLevelStatistics,_FLevelStatistics>::Grow
                  ((TArray<FLevelStatistics,_FLevelStatistics> *)local_88.Chars,1);
        pFVar2 = ((TArray<FLevelStatistics,_FLevelStatistics> *)(local_98._8_8_ + 0x38))->Array;
        uVar7 = ((TArray<FLevelStatistics,_FLevelStatistics> *)(local_98._8_8_ + 0x38))->Count;
        pFVar2[uVar7].timeneeded = local_78.super_FLevelStatistics.timeneeded;
        pFVar4 = pFVar2 + uVar7;
        pFVar4->playerclass = local_78.super_FLevelStatistics.playerclass;
        pFVar4->name[0] = local_78.super_FLevelStatistics.name[0];
        pFVar4->name[1] = local_78.super_FLevelStatistics.name[1];
        pFVar4->name[2] = local_78.super_FLevelStatistics.name[2];
        pFVar4->name[3] = local_78.super_FLevelStatistics.name[3];
        pFVar4->name[4] = local_78.super_FLevelStatistics.name[4];
        pFVar4->name[5] = local_78.super_FLevelStatistics.name[5];
        *(ulong *)(&pFVar4->playerclass + 4) =
             CONCAT35(local_78.super_FLevelStatistics._45_3_,
                      CONCAT41(local_78.super_FLevelStatistics.name._7_4_,
                               local_78.super_FLevelStatistics.name[6]));
        *(undefined8 *)(pFVar2[uVar7].info + 0x10) = local_78.super_FLevelStatistics.info._16_8_;
        *(ulong *)(pFVar2[uVar7].info + 0x10 + 8) =
             CONCAT26(local_78.super_FLevelStatistics.skill,
                      local_78.super_FLevelStatistics.info._24_6_);
        *(undefined8 *)pFVar2[uVar7].info = local_78.super_FLevelStatistics.info._0_8_;
        *(undefined8 *)(pFVar2[uVar7].info + 8) = local_78.super_FLevelStatistics.info._8_8_;
        puVar1 = &((TArray<FLevelStatistics,_FLevelStatistics> *)(local_98._8_8_ + 0x38))->Count;
        *puVar1 = *puVar1 + 1;
        FString::~FString((FString *)(local_98 + 0x18));
        uVar13 = uVar13 + 1;
        lVar17 = lVar17 + 0x20;
      } while (uVar13 < LevelData.Count);
    }
    __stream = fopen(statfile.Value,"wt");
    if (__stream != (FILE *)0x0) {
      qsort(EpisodeStatistics.Array,(ulong)EpisodeStatistics.Count,0x20,compare_episode_names);
      if (EpisodeStatistics.Count != 0) {
        pFVar18 = (FSessionStatistics *)0x0;
        do {
          pFVar12 = EpisodeStatistics.Array;
          local_98._8_8_ = pFVar18;
          qsort(EpisodeStatistics.Array[(long)pFVar18].stats.Array,
                (ulong)EpisodeStatistics.Array[(long)pFVar18].stats.Count,0x48,compare_dates);
          FVar20.Chars = (char *)(pFVar12 + (long)pFVar18);
          fprintf(__stream,"%s \"%s\"\n{\n",(((FStatistics *)FVar20.Chars)->epi_header).Chars,
                  (((FStatistics *)FVar20.Chars)->epi_name).Chars);
          if ((((FStatistics *)FVar20.Chars)->stats).Count != 0) {
            uVar13 = 0;
            local_88.Chars = FVar20.Chars;
            do {
              pFVar18 = (((FStatistics *)FVar20.Chars)->stats).Array;
              if ('\0' < pFVar18[uVar13].super_FLevelStatistics.info[0]) {
                pFVar18 = pFVar18 + uVar13;
                iVar6 = (pFVar18->super_FLevelStatistics).timeneeded;
                iVar22 = (iVar6 % 0x834) / 0x23;
                iVar14 = (int)(pFVar18->super_FLevelStatistics).skill;
                fprintf(__stream,"\t%2i. %10s \"%-22s\" %02d:%02d:%02d %i\n",
                        (ulong)((int)uVar13 + 1),(pFVar18->super_FLevelStatistics).name,pFVar18,
                        (ulong)(uint)(iVar6 / 0x1ec30),(iVar6 % 0x1ec30) / 0x834,iVar22,iVar14);
                if ((pFVar18->levelstats).Count != 0) {
                  fwrite("\t{\n",3,1,__stream);
                  qsort((pFVar18->levelstats).Array,(ulong)(pFVar18->levelstats).Count,0x34,
                        compare_level_names);
                  if ((pFVar18->levelstats).Count != 0) {
                    lVar17 = 0x22;
                    uVar19 = 0;
                    do {
                      pFVar2 = (pFVar18->levelstats).Array;
                      iVar6 = *(int *)(pFVar2->info + lVar17 + 0xe);
                      fprintf(__stream,"\t\t%-8s \"%-22s\" %02d:%02d:%02d\n",pFVar2->info + lVar17,
                              pFVar2->info + lVar17 + -0x22,(ulong)(uint)(iVar6 / 0x1ec30),
                              (ulong)(uint)((iVar6 % 0x1ec30) / 0x834),(iVar6 % 0x834) / 0x23,iVar22
                              ,iVar14);
                      uVar19 = uVar19 + 1;
                      lVar17 = lVar17 + 0x34;
                    } while (uVar19 < (pFVar18->levelstats).Count);
                  }
                  fwrite("\t}\n",3,1,__stream);
                  FVar20.Chars = local_88.Chars;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (((FStatistics *)FVar20.Chars)->stats).Count);
          }
          fwrite("}\n\n",3,1,__stream);
          pFVar18 = (FSessionStatistics *)(((FLevelStatistics *)local_98._8_8_)->info + 1);
        } while (pFVar18 < (FSessionStatistics *)(ulong)EpisodeStatistics.Count);
      }
      fclose(__stream);
    }
    FString::~FString(&local_a8);
    FString::~FString(&local_a0);
  }
  return;
}

Assistant:

void STAT_ChangeLevel(const char *newl)
{
	// record the current level's stats.
	StoreLevelStats();

	level_info_t *thisinfo = level.info;
	level_info_t *nextinfo = NULL;
	
	if (strncmp(newl, "enDSeQ", 6))
	{
		level_info_t *l = FindLevelInfo (newl);
		nextinfo = l->CheckLevelRedirect ();
		if (nextinfo == NULL) nextinfo = l;
	}

	if (savestatistics == 1)
	{
		if ((nextinfo == NULL || (nextinfo->flags2 & LEVEL2_ENDGAME)) && StartEpisode != NULL)
		{
			// we reached the end of this episode
			int wad = 0;
			MapData * map = P_OpenMapData(StartEpisode->mEpisodeMap, false);
			if (map != NULL)
			{
				wad = Wads.GetLumpFile(map->lumpnum);
				delete map;
			}
			const char * name = Wads.GetWadName(wad);
			FString section = ExtractFileBase(name) + "." + StartEpisode->mEpisodeMap;
			section.ToUpper();

			const char *ep_name = StartEpisode->mEpisodeName;
			if (*ep_name == '$') ep_name = GStrings[ep_name+1];
			FStatistics *sl = GetStatisticsList(EpisodeStatistics, section, ep_name);

			int statvals[4] = {0,0,0,0};
			FString infostring;
			int validlevels = LevelData.Size();
			for(unsigned i = 0; i < LevelData.Size(); i++)
			{
				statvals[0] += LevelData[i].killcount;
				statvals[1] += LevelData[i].totalkills;
				statvals[2] += LevelData[i].secretcount;
				statvals[3] += LevelData[i].totalsecrets;
			}

			infostring.Format("%4d/%4d, %3d/%3d, %2d", statvals[0], statvals[1], statvals[2], statvals[3], validlevels);
			FSessionStatistics *es = StatisticsEntry(sl, infostring, AdjustTics(level.totaltime));

			for(unsigned i = 0; i < LevelData.Size(); i++)
			{
				FString lsection = LevelData[i].Levelname;
				lsection.ToUpper();
				infostring.Format("%4d/%4d, %3d/%3d",
					 LevelData[i].killcount, LevelData[i].totalkills, LevelData[i].secretcount, LevelData[i].totalsecrets);

				LevelStatEntry(es, lsection, infostring, LevelData[i].leveltime);
			}
			SaveStatistics(statfile, EpisodeStatistics);
		}
	}
	else if (savestatistics == 2)	// todo: handle single level statistics.
	{
	}
}